

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int blobSeekToRow(Incrblob *p,sqlite3_int64 iRow,char **pzErr)

{
  ushort uVar1;
  Vdbe *p_00;
  VdbeCursor *pVVar2;
  sqlite3 *db;
  BtCursor *pBVar3;
  int iVar4;
  char *pcVar5;
  uint uVar6;
  char *pcVar7;
  
  p_00 = (Vdbe *)p->pStmt;
  sqlite3VdbeMemSetInt64(p_00->aMem + 1,iRow);
  if (p_00->pc < 5) {
    iVar4 = sqlite3_step(p->pStmt);
  }
  else {
    p_00->pc = 4;
    iVar4 = sqlite3VdbeExec(p_00);
  }
  if (iVar4 == 100) {
    pVVar2 = *p_00->apCsr;
    uVar1 = p->iCol;
    if (uVar1 < pVVar2->nHdrParsed) {
      uVar6 = pVVar2->aType[uVar1];
      if (0xb < uVar6) {
        p->iOffset = pVVar2->aType[(long)pVVar2->nField + (ulong)uVar1];
        if (uVar6 < 0x80) {
          uVar6 = (uint)""[uVar6];
        }
        else {
          uVar6 = uVar6 - 0xc >> 1;
        }
        p->nByte = uVar6;
        pBVar3 = (pVVar2->uc).pCursor;
        p->pCsr = pBVar3;
        pBVar3->curFlags = pBVar3->curFlags | 0x10;
        pBVar3->pBtree->hasIncrblobCur = '\x01';
        pcVar5 = (char *)0x0;
        iVar4 = 0;
        goto LAB_0011e42e;
      }
      pcVar7 = "integer";
      if (uVar6 == 7) {
        pcVar7 = "real";
      }
      pcVar5 = "null";
      if (uVar6 != 0) {
        pcVar5 = pcVar7;
      }
    }
    else {
      pcVar5 = "null";
    }
    pcVar5 = sqlite3MPrintf(p->db,"cannot open value of type %s",pcVar5);
    sqlite3_finalize(p->pStmt);
    p->pStmt = (sqlite3_stmt *)0x0;
  }
  else {
    if (p->pStmt == (sqlite3_stmt *)0x0) {
      pcVar5 = (char *)0x0;
      goto LAB_0011e42e;
    }
    iVar4 = sqlite3_finalize(p->pStmt);
    p->pStmt = (sqlite3_stmt *)0x0;
    db = p->db;
    if (iVar4 != 0) {
      pcVar5 = sqlite3_errmsg(db);
      pcVar5 = sqlite3MPrintf(db,"%s",pcVar5);
      goto LAB_0011e42e;
    }
    pcVar5 = sqlite3MPrintf(db,"no such rowid: %lld",iRow);
  }
  iVar4 = 1;
LAB_0011e42e:
  *pzErr = pcVar5;
  return iVar4;
}

Assistant:

static int blobSeekToRow(Incrblob *p, sqlite3_int64 iRow, char **pzErr){
  int rc;                         /* Error code */
  char *zErr = 0;                 /* Error message */
  Vdbe *v = (Vdbe *)p->pStmt;

  /* Set the value of register r[1] in the SQL statement to integer iRow.
  ** This is done directly as a performance optimization
  */
  sqlite3VdbeMemSetInt64(&v->aMem[1], iRow);

  /* If the statement has been run before (and is paused at the OP_ResultRow)
  ** then back it up to the point where it does the OP_NotExists.  This could
  ** have been down with an extra OP_Goto, but simply setting the program
  ** counter is faster. */
  if( v->pc>4 ){
    v->pc = 4;
    assert( v->aOp[v->pc].opcode==OP_NotExists );
    rc = sqlite3VdbeExec(v);
  }else{
    rc = sqlite3_step(p->pStmt);
  }
  if( rc==SQLITE_ROW ){
    VdbeCursor *pC = v->apCsr[0];
    u32 type;
    assert( pC!=0 );
    assert( pC->eCurType==CURTYPE_BTREE );
    type = pC->nHdrParsed>p->iCol ? pC->aType[p->iCol] : 0;
    testcase( pC->nHdrParsed==p->iCol );
    testcase( pC->nHdrParsed==p->iCol+1 );
    if( type<12 ){
      zErr = sqlite3MPrintf(p->db, "cannot open value of type %s",
          type==0?"null": type==7?"real": "integer"
      );
      rc = SQLITE_ERROR;
      sqlite3_finalize(p->pStmt);
      p->pStmt = 0;
    }else{
      p->iOffset = pC->aType[p->iCol + pC->nField];
      p->nByte = sqlite3VdbeSerialTypeLen(type);
      p->pCsr =  pC->uc.pCursor;
      sqlite3BtreeIncrblobCursor(p->pCsr);
    }
  }

  if( rc==SQLITE_ROW ){
    rc = SQLITE_OK;
  }else if( p->pStmt ){
    rc = sqlite3_finalize(p->pStmt);
    p->pStmt = 0;
    if( rc==SQLITE_OK ){
      zErr = sqlite3MPrintf(p->db, "no such rowid: %lld", iRow);
      rc = SQLITE_ERROR;
    }else{
      zErr = sqlite3MPrintf(p->db, "%s", sqlite3_errmsg(p->db));
    }
  }

  assert( rc!=SQLITE_OK || zErr==0 );
  assert( rc!=SQLITE_ROW && rc!=SQLITE_DONE );

  *pzErr = zErr;
  return rc;
}